

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall
VectorsTest_Int3LesserOrEqual_Test::TestBody(VectorsTest_Int3LesserOrEqual_Test *this)

{
  bool bVar1;
  char *pcVar2;
  String *this_00;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Int3 v3;
  Int3 v2;
  Int3 v1;
  undefined1 in_stack_fffffffffffffdef;
  String *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  undefined1 uVar3;
  undefined8 in_stack_fffffffffffffe08;
  int line;
  char *in_stack_fffffffffffffe10;
  AssertionResult *this_01;
  Type in_stack_fffffffffffffe1c;
  Type type;
  AssertHelper *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  undefined1 uVar4;
  AssertHelper *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  AssertionResult *this_02;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined1 uVar5;
  AssertionResult *in_stack_fffffffffffffe68;
  String local_168 [2];
  AssertionResult local_148;
  String local_138 [2];
  AssertionResult local_118;
  String local_108 [2];
  AssertionResult local_e8;
  String local_d8 [2];
  AssertionResult local_b8;
  String local_a8 [2];
  AssertionResult local_88;
  uint local_74;
  String local_70 [3];
  AssertionResult local_40;
  Vector3<int> local_2c;
  Vector3<int> local_20;
  Vector3<int> local_14;
  
  line = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  pica::Vector3<int>::Vector3(&local_14,0xd,0x19,0x15);
  pica::Vector3<int>::Vector3(&local_20,6,8,2);
  pica::Vector3<int>::Vector3(&local_2c,0xe,0x19,1);
  pica::operator<=(&local_14,&local_20);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe20);
    testing::internal::GetBoolAssertionFailureMessage
              (in_stack_fffffffffffffe68,
               (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
    in_stack_fffffffffffffe68 = (AssertionResult *)testing::internal::String::c_str(local_70);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10,line,
               (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe50,
               (Message *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
    testing::internal::String::~String(in_stack_fffffffffffffdf0);
    testing::Message::~Message((Message *)0x1dc784);
  }
  local_74 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dc812);
  if (local_74 == 0) {
    pica::operator<=(&local_20,&local_14);
    this_02 = &local_88;
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
    uVar5 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe20);
      testing::internal::GetBoolAssertionFailureMessage
                (in_stack_fffffffffffffe68,(char *)CONCAT17(uVar5,in_stack_fffffffffffffe60),
                 &this_02->success_,(char *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe50 = (AssertHelper *)testing::internal::String::c_str(local_a8);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10,line,
                 (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe50,
                 (Message *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
      testing::internal::String::~String(in_stack_fffffffffffffdf0);
      testing::Message::~Message((Message *)0x1dc94a);
    }
    local_74 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dc9d8);
    if (local_74 == 0) {
      pica::operator<=(&local_14,&local_2c);
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
      uVar4 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe20);
        testing::internal::GetBoolAssertionFailureMessage
                  (in_stack_fffffffffffffe68,(char *)CONCAT17(uVar5,in_stack_fffffffffffffe60),
                   &this_02->success_,(char *)in_stack_fffffffffffffe50);
        testing::internal::String::c_str(local_d8);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10,
                   line,(char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe50,(Message *)CONCAT17(uVar4,in_stack_fffffffffffffe48));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
        testing::internal::String::~String(in_stack_fffffffffffffdf0);
        testing::Message::~Message((Message *)0x1dcb12);
      }
      local_74 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcba0);
      if (local_74 == 0) {
        pica::operator<=(&local_2c,&local_14);
        testing::AssertionResult::AssertionResult
                  ((AssertionResult *)in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe20);
          testing::internal::GetBoolAssertionFailureMessage
                    (in_stack_fffffffffffffe68,(char *)CONCAT17(uVar5,in_stack_fffffffffffffe60),
                     &this_02->success_,(char *)in_stack_fffffffffffffe50);
          in_stack_fffffffffffffe20 = (AssertHelper *)testing::internal::String::c_str(local_108);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10,
                     line,(char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe50,(Message *)CONCAT17(uVar4,in_stack_fffffffffffffe48))
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdf0);
          testing::internal::String::~String(in_stack_fffffffffffffdf0);
          testing::Message::~Message((Message *)0x1dccda);
        }
        local_74 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcd68);
        if (local_74 == 0) {
          pica::operator<=(&local_20,&local_2c);
          this_01 = &local_118;
          testing::AssertionResult::AssertionResult
                    ((AssertionResult *)in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
          type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe1c);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe20);
            testing::internal::GetBoolAssertionFailureMessage
                      (in_stack_fffffffffffffe68,(char *)CONCAT17(uVar5,in_stack_fffffffffffffe60),
                       &this_02->success_,(char *)in_stack_fffffffffffffe50);
            pcVar2 = testing::internal::String::c_str(local_138);
            line = (int)((ulong)pcVar2 >> 0x20);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffe20,type,&this_01->success_,line,
                       (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe50,
                       (Message *)CONCAT17(uVar4,in_stack_fffffffffffffe48));
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdf0);
            testing::internal::String::~String(in_stack_fffffffffffffdf0);
            testing::Message::~Message((Message *)0x1dcea2);
          }
          local_74 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcf30);
          if (local_74 == 0) {
            pica::operator<=(&local_2c,&local_20);
            testing::AssertionResult::AssertionResult
                      ((AssertionResult *)in_stack_fffffffffffffdf0,(bool)in_stack_fffffffffffffdef)
            ;
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
            if (!bVar1) {
              uVar3 = bVar1;
              testing::Message::Message((Message *)in_stack_fffffffffffffe20);
              testing::internal::GetBoolAssertionFailureMessage
                        (in_stack_fffffffffffffe68,(char *)CONCAT17(uVar5,in_stack_fffffffffffffe60)
                         ,&this_02->success_,(char *)in_stack_fffffffffffffe50);
              this_00 = (String *)testing::internal::String::c_str(local_168);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffe20,type,&this_01->success_,line,
                         (char *)CONCAT17(uVar3,in_stack_fffffffffffffe00));
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffe50,
                         (Message *)CONCAT17(uVar4,in_stack_fffffffffffffe48));
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
              testing::internal::String::~String(this_00);
              testing::Message::~Message((Message *)0x1dd06a);
            }
            local_74 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd0f8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, Int3LesserOrEqual)
{
    Int3 v1(13, 25, 21), v2(6, 8, 2), v3(14, 25, 1);
    ASSERT_FALSE(v1 <= v2);
    ASSERT_TRUE(v2 <= v1);
    ASSERT_FALSE(v1 <= v3);
    ASSERT_FALSE(v3 <= v1);
    ASSERT_FALSE(v2 <= v3);
    ASSERT_FALSE(v3 <= v2);
}